

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chess.cpp
# Opt level: O0

void __thiscall EvaluatorStandard::EvaluatorStandard(EvaluatorStandard *this)

{
  EvaluatorStandard *this_local;
  
  EvaluatorWeighted::EvaluatorWeighted(&this->super_EvaluatorWeighted);
  (this->super_EvaluatorWeighted).super_EvaluatorBase._vptr_EvaluatorBase =
       (_func_int **)&PTR_Evaluate_0014fb48;
  EvaluatorMaterial::EvaluatorMaterial(&this->m_Material);
  EvaluatorSimpleMobility::EvaluatorSimpleMobility(&this->m_SimpleMobility);
  EvaluatorPieceSquare::EvaluatorPieceSquare(&this->m_PieceSquareEvaluator);
  EvaluatorMopUp::EvaluatorMopUp(&this->m_MopUp);
  EvaluatorWeighted::EvaluatorWeighted(&this->m_Weighted);
  EvaluatorWeighted::Add(&this->m_Weighted,(EvaluatorBase *)&this->m_Material,1.0);
  EvaluatorWeighted::Add(&this->m_Weighted,&(this->m_SimpleMobility).super_EvaluatorBase,0.1);
  EvaluatorWeighted::Add(&this->m_Weighted,&(this->m_PieceSquareEvaluator).super_EvaluatorBase,0.8);
  return;
}

Assistant:

EvaluatorStandard()
    {
        m_Weighted.Add( m_Material );
        m_Weighted.Add( m_SimpleMobility, 0.1f );
        m_Weighted.Add( m_PieceSquareEvaluator, 0.8f );
    }